

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O3

void slang::ast::BinaryExpression::analyzeOpTypes
               (Type *clt,Type *crt,Type *originalLt,Type *originalRt,Expression *lhs,
               Expression *rhs,ASTContext *context,SourceRange opRange,DiagCode code,
               bool isComparison,
               optional<std::basic_string_view<char,_std::char_traits<char>_>_> extraDiagArg)

{
  byte bVar1;
  __index_type _Var2;
  bool bVar3;
  bool bVar4;
  logic_t lVar5;
  EffectiveSign left;
  EffectiveSign right;
  bitwidth_t bVar6;
  uint uVar7;
  uint uVar8;
  Symbol *pSVar9;
  Symbol *pSVar10;
  Type *pTVar11;
  Diagnostic *pDVar12;
  Diagnostic *pDVar13;
  Type *pTVar14;
  variant_alternative_t<1UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *pvVar15;
  optional<unsigned_int> oVar16;
  ConstantValue rcv;
  EvalContext evalCtx;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_410;
  uint uStack_408;
  undefined1 uStack_404;
  byte bStack_403;
  ASTContext *local_400;
  DiagCode local_3f4;
  Type *local_3f0;
  Type *local_3e8;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_3e0;
  _Optional_payload_base<unsigned_int> local_3b8;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_3b0;
  EvalContext local_388;
  
  local_3f4 = code;
  local_400 = context;
  local_3f0 = originalLt;
  local_3e8 = originalRt;
  pSVar9 = Expression::getSymbolReference(lhs,true);
  pSVar10 = Expression::getSymbolReference(rhs,true);
  if (pSVar9 != (Symbol *)0x0) {
    if (pSVar9->kind == Parameter) {
      bVar1 = pSVar9[5].field_0x34;
    }
    else {
      if (pSVar9->kind != Variable) goto LAB_00438094;
      bVar1 = *(byte *)((long)&pSVar9[5].name._M_str + 4) & 2;
    }
    if (bVar1 != 0) {
      return;
    }
  }
LAB_00438094:
  if (pSVar10 != (Symbol *)0x0) {
    if (pSVar10->kind == Parameter) {
      bVar1 = pSVar10[5].field_0x34;
    }
    else {
      if (pSVar10->kind != Variable) goto LAB_004380c1;
      bVar1 = *(byte *)((long)&pSVar10[5].name._M_str + 4) & 2;
    }
    if (bVar1 != 0) {
      return;
    }
  }
LAB_004380c1:
  if (isComparison) {
    if ((pSVar9 != (Symbol *)0x0) && (pSVar9->kind == EnumValue)) {
      pTVar11 = DeclaredType::getType((DeclaredType *)(pSVar9 + 1));
      pTVar14 = pTVar11->canonical;
      if (pTVar14 == (Type *)0x0) {
        Type::resolveCanonical(pTVar11);
        pTVar14 = pTVar11->canonical;
      }
      if (((pTVar14->super_Symbol).kind == EnumType) &&
         (bVar3 = Type::isMatching(pTVar14[1].canonical,crt), bVar3)) {
        return;
      }
    }
    if ((pSVar10 != (Symbol *)0x0) && (pSVar10->kind == EnumValue)) {
      pTVar11 = DeclaredType::getType((DeclaredType *)(pSVar10 + 1));
      pTVar14 = pTVar11->canonical;
      if (pTVar14 == (Type *)0x0) {
        Type::resolveCanonical(pTVar11);
        pTVar14 = pTVar11->canonical;
      }
      if (((pTVar14->super_Symbol).kind == EnumType) &&
         (bVar3 = Type::isMatching(pTVar14[1].canonical,clt), bVar3)) {
        return;
      }
    }
  }
  bVar3 = Type::isSimpleBitVector(clt);
  if ((bVar3) && (bVar3 = Type::isSimpleBitVector(crt), bVar3)) {
    bVar3 = Type::isSigned(clt);
    bVar4 = Type::isSigned(crt);
    if (bVar3 == bVar4) {
      if (isComparison) {
        return;
      }
    }
    else {
      left = Expression::getEffectiveSign(lhs,false);
      right = Expression::getEffectiveSign(rhs,false);
      bVar3 = Expression::signMatches(left,right);
      if (isComparison) {
        if (bVar3) {
          return;
        }
        bVar6 = Type::getBitWidth(clt);
        if (bVar6 == 8) {
          pTVar14 = clt->canonical;
          if (pTVar14 == (Type *)0x0) {
            Type::resolveCanonical(clt);
            pTVar14 = clt->canonical;
          }
          if (((pTVar14->super_Symbol).kind == PredefinedIntegerType) &&
             (bVar3 = Expression::isImplicitString(rhs), bVar3)) {
            return;
          }
        }
        bVar6 = Type::getBitWidth(crt);
        if (bVar6 == 8) {
          pTVar14 = crt->canonical;
          if (pTVar14 == (Type *)0x0) {
            Type::resolveCanonical(crt);
            pTVar14 = crt->canonical;
          }
          if (((pTVar14->super_Symbol).kind == PredefinedIntegerType) &&
             (bVar3 = Expression::isImplicitString(lhs), bVar3)) {
            return;
          }
        }
        pDVar12 = ASTContext::addDiag(local_400,(DiagCode)0xd30007,opRange);
        pDVar13 = ast::operator<<(pDVar12,local_3f0);
        ast::operator<<(pDVar13,local_3e8);
        pDVar12 = Diagnostic::operator<<(pDVar12,lhs->sourceRange);
        Diagnostic::operator<<(pDVar12,rhs->sourceRange);
        return;
      }
      if (!bVar3) goto LAB_00438773;
    }
    uVar7 = Type::getBitWidth(clt);
    uVar8 = Type::getBitWidth(crt);
    if (uVar7 == uVar8) {
      return;
    }
    oVar16 = Expression::getEffectiveWidth(lhs);
    local_3b8 = (_Optional_payload_base<unsigned_int>)Expression::getEffectiveWidth(rhs);
    if (((ulong)local_3b8 >> 0x20 & 1) == 0 ||
        ((ulong)oVar16.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_int> >> 0x20 & 1) == 0) {
      return;
    }
    if (oVar16.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_payload <= uVar8 &&
        local_3b8._M_payload._M_value <= uVar7) {
      return;
    }
    local_388.astCtx.assertionInstance = local_400->assertionInstance;
    local_388.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.data_ =
         (pointer)local_388.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.firstElement
    ;
    local_388.astCtx.scope.ptr = (local_400->scope).ptr;
    local_388.astCtx.lookupIndex = local_400->lookupIndex;
    local_388.astCtx._12_4_ = *(undefined4 *)&local_400->field_0xc;
    local_388.astCtx.flags.m_bits = (local_400->flags).m_bits;
    local_388.astCtx.instanceOrProc = local_400->instanceOrProc;
    local_388.astCtx.firstTempVar = local_400->firstTempVar;
    local_388.astCtx.randomizeDetails = local_400->randomizeDetails;
    local_388.flags.m_bits = '\0';
    local_388._60_8_ = 0;
    local_388._68_8_ = 0;
    local_388.queueTarget._4_4_ = 0;
    local_388.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.len = 0;
    local_388.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.cap = 2;
    local_388.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.data_ =
         (pointer)local_388.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.firstElement;
    local_388.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.len = 0;
    local_388.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.cap = 5;
    local_388.diags.super_SmallVector<slang::Diagnostic,_2UL>.
    super_SmallVectorBase<slang::Diagnostic>.data_ =
         (pointer)local_388.diags.super_SmallVector<slang::Diagnostic,_2UL>.
                  super_SmallVectorBase<slang::Diagnostic>.firstElement;
    local_388.diags.super_SmallVector<slang::Diagnostic,_2UL>.
    super_SmallVectorBase<slang::Diagnostic>.len = 0;
    local_388.diags.super_SmallVector<slang::Diagnostic,_2UL>.
    super_SmallVectorBase<slang::Diagnostic>.cap = 2;
    local_388.warnings.super_SmallVector<slang::Diagnostic,_2UL>.
    super_SmallVectorBase<slang::Diagnostic>.data_ =
         (pointer)local_388.warnings.super_SmallVector<slang::Diagnostic,_2UL>.
                  super_SmallVectorBase<slang::Diagnostic>.firstElement;
    local_388.warnings.super_SmallVector<slang::Diagnostic,_2UL>.
    super_SmallVectorBase<slang::Diagnostic>.len = 0;
    local_388.warnings.super_SmallVector<slang::Diagnostic,_2UL>.
    super_SmallVectorBase<slang::Diagnostic>.cap = 2;
    local_388.backtraceReported = false;
    local_388.disableRange.startLoc = (SourceLocation)0x0;
    local_388.disableRange.endLoc = (SourceLocation)0x0;
    Expression::eval((ConstantValue *)&local_3e0,lhs,&local_388);
    _Var2 = local_3e0._M_index;
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
    ::~_Variant_storage(&local_3e0);
    Expression::eval((ConstantValue *)&local_3e0,rhs,&local_388);
    if (_Var2 != '\0') {
      uVar7 = 0xffffff;
    }
    if (local_3e0._M_index != '\0') {
      uVar8 = 0xffffff;
    }
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
    ::~_Variant_storage(&local_3e0);
    EvalContext::~EvalContext(&local_388);
    if ((oVar16.super__Optional_base<unsigned_int,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_int>._M_payload <= uVar8) &&
       (local_3b8._M_payload._M_value <= uVar7)) {
      return;
    }
  }
  else {
    bVar3 = Type::isHandleType(clt);
    if ((bVar3) && (bVar3 = Type::isHandleType(crt), bVar3)) {
      return;
    }
    bVar3 = Type::isNumeric(clt);
    if ((bVar3) && (bVar3 = Type::isNumeric(crt), bVar3)) {
      local_388.astCtx.assertionInstance = local_400->assertionInstance;
      local_388.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.data_ =
           (pointer)local_388.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.
                    firstElement;
      local_388.astCtx.scope.ptr = (local_400->scope).ptr;
      local_388.astCtx.lookupIndex = local_400->lookupIndex;
      local_388.astCtx._12_4_ = *(undefined4 *)&local_400->field_0xc;
      local_388.astCtx.flags.m_bits = (local_400->flags).m_bits;
      local_388.astCtx.instanceOrProc = local_400->instanceOrProc;
      local_388.astCtx.firstTempVar = local_400->firstTempVar;
      local_388.astCtx.randomizeDetails = local_400->randomizeDetails;
      local_388.flags.m_bits = '\0';
      local_388._60_8_ = 0;
      local_388._68_8_ = 0;
      local_388.queueTarget._4_4_ = 0;
      local_388.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.len = 0;
      local_388.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.cap = 2;
      local_388.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.data_ =
           (pointer)local_388.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.firstElement;
      local_388.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.len = 0;
      local_388.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.cap = 5;
      local_388.diags.super_SmallVector<slang::Diagnostic,_2UL>.
      super_SmallVectorBase<slang::Diagnostic>.data_ =
           (pointer)local_388.diags.super_SmallVector<slang::Diagnostic,_2UL>.
                    super_SmallVectorBase<slang::Diagnostic>.firstElement;
      local_388.diags.super_SmallVector<slang::Diagnostic,_2UL>.
      super_SmallVectorBase<slang::Diagnostic>.len = 0;
      local_388.diags.super_SmallVector<slang::Diagnostic,_2UL>.
      super_SmallVectorBase<slang::Diagnostic>.cap = 2;
      local_388.warnings.super_SmallVector<slang::Diagnostic,_2UL>.
      super_SmallVectorBase<slang::Diagnostic>.data_ =
           (pointer)local_388.warnings.super_SmallVector<slang::Diagnostic,_2UL>.
                    super_SmallVectorBase<slang::Diagnostic>.firstElement;
      local_388.warnings.super_SmallVector<slang::Diagnostic,_2UL>.
      super_SmallVectorBase<slang::Diagnostic>.len = 0;
      local_388.warnings.super_SmallVector<slang::Diagnostic,_2UL>.
      super_SmallVectorBase<slang::Diagnostic>.cap = 2;
      local_388.backtraceReported = false;
      local_388.disableRange.startLoc = (SourceLocation)0x0;
      local_388.disableRange.endLoc = (SourceLocation)0x0;
      Expression::eval((ConstantValue *)&local_3e0,lhs,&local_388);
      Expression::eval((ConstantValue *)&local_3b0,rhs,&local_388);
      if (local_3b0._M_index != '\0' || local_3e0._M_index != '\0') {
        pTVar14 = clt->canonical;
        if (pTVar14 == (Type *)0x0) {
          Type::resolveCanonical(clt);
          pTVar14 = clt->canonical;
        }
        if (((pTVar14->super_Symbol).kind == FloatingType) &&
           (bVar3 = Type::isIntegral(crt), bVar3 && local_3b0._M_index != '\0')) {
LAB_00438544:
          std::__detail::__variant::
          _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          ::~_Variant_storage(&local_3b0);
          std::__detail::__variant::
          _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          ::~_Variant_storage(&local_3e0);
          EvalContext::~EvalContext(&local_388);
          return;
        }
        pTVar14 = crt->canonical;
        if (pTVar14 == (Type *)0x0) {
          Type::resolveCanonical(crt);
          pTVar14 = crt->canonical;
        }
        if (((pTVar14->super_Symbol).kind == FloatingType) &&
           (bVar3 = Type::isIntegral(clt), bVar3 && local_3e0._M_index != '\0')) goto LAB_00438544;
        if (isComparison) {
          if (local_3e0._M_index == '\x01') {
            pvVar15 = std::
                      get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                                ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                  *)&local_3e0);
            bStack_403 = 0;
            local_410.val._0_6_ = 0;
            local_410.val._6_2_ = 0;
            uStack_404 = 1;
            uStack_408 = 1;
            SVInt::clearUnusedBits((SVInt *)&local_410);
            lVar5 = SVInt::operator==(pvVar15,(SVInt *)&local_410);
            if (((0x40 < uStack_408) || ((bStack_403 & 1) != 0)) &&
               ((void *)CONCAT26(local_410.val._6_2_,local_410.val._0_6_) != (void *)0x0)) {
              operator_delete__((void *)CONCAT26(local_410.val._6_2_,local_410.val._0_6_));
            }
            if ((lVar5.value != '\0' && lVar5.value != 0x80) && lVar5.value != '@')
            goto LAB_00438544;
          }
          if (local_3b0._M_index == '\x01') {
            pvVar15 = std::
                      get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                                ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                  *)&local_3b0);
            bStack_403 = 0;
            local_410.val._0_6_ = 0;
            local_410.val._6_2_ = 0;
            uStack_404 = 1;
            uStack_408 = 1;
            SVInt::clearUnusedBits((SVInt *)&local_410);
            lVar5 = SVInt::operator==(pvVar15,(SVInt *)&local_410);
            if (((0x40 < uStack_408) || ((bStack_403 & 1) != 0)) &&
               ((void *)CONCAT26(local_410.val._6_2_,local_410.val._0_6_) != (void *)0x0)) {
              operator_delete__((void *)CONCAT26(local_410.val._6_2_,local_410.val._0_6_));
            }
            if ((lVar5.value != '\0' && lVar5.value != 0x80) && lVar5.value != '@')
            goto LAB_00438544;
          }
        }
      }
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ::~_Variant_storage(&local_3b0);
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ::~_Variant_storage(&local_3e0);
      EvalContext::~EvalContext(&local_388);
    }
    else {
      pTVar14 = clt->canonical;
      if (pTVar14 == (Type *)0x0) {
        Type::resolveCanonical(clt);
        pTVar14 = clt->canonical;
      }
      if (((pTVar14->super_Symbol).kind == StringType) &&
         (bVar3 = Expression::isImplicitString(rhs), bVar3)) {
        return;
      }
      pTVar14 = crt->canonical;
      if (pTVar14 == (Type *)0x0) {
        Type::resolveCanonical(crt);
        pTVar14 = crt->canonical;
      }
      if (((pTVar14->super_Symbol).kind == StringType) &&
         (bVar3 = Expression::isImplicitString(lhs), bVar3)) {
        return;
      }
    }
  }
LAB_00438773:
  pDVar12 = ASTContext::addDiag(local_400,local_3f4,opRange);
  if (extraDiagArg.
      super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
      _M_payload.
      super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
      _M_engaged == true) {
    Diagnostic::operator<<
              (pDVar12,extraDiagArg.
                       super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                       ._M_payload.
                       super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                       ._M_payload._M_value);
  }
  pDVar13 = ast::operator<<(pDVar12,local_3f0);
  ast::operator<<(pDVar13,local_3e8);
  pDVar12 = Diagnostic::operator<<(pDVar12,lhs->sourceRange);
  Diagnostic::operator<<(pDVar12,rhs->sourceRange);
  return;
}

Assistant:

void BinaryExpression::analyzeOpTypes(const Type& clt, const Type& crt, const Type& originalLt,
                                      const Type& originalRt, const Expression& lhs,
                                      const Expression& rhs, const ASTContext& context,
                                      SourceRange opRange, DiagCode code, bool isComparison,
                                      std::optional<std::string_view> extraDiagArg) {
    // Don't warn if either side is a compiler generated variable
    // (which can be true for genvars).
    auto isCompGenVar = [](const Symbol* sym) {
        if (sym) {
            if (sym->kind == SymbolKind::Variable &&
                sym->as<VariableSymbol>().flags.has(VariableFlags::CompilerGenerated)) {
                return true;
            }

            if (sym->kind == SymbolKind::Parameter && sym->as<ParameterSymbol>().isFromGenvar()) {
                return true;
            }
        }
        return false;
    };

    auto lsym = lhs.getSymbolReference(), rsym = rhs.getSymbolReference();
    if (isCompGenVar(lsym) || isCompGenVar(rsym))
        return;

    // Don't warn if either side is an enum value symbol and the
    // other side is the base type of that enum.
    auto isEnumBaseCompare = [](const Symbol* sym, const Type& otherType) {
        if (sym && sym->kind == SymbolKind::EnumValue) {
            auto& ct = sym->as<EnumValueSymbol>().getType().getCanonicalType();
            if (ct.kind == SymbolKind::EnumType)
                return ct.as<EnumType>().baseType.isMatching(otherType);
        }
        return false;
    };

    if (isComparison && (isEnumBaseCompare(lsym, crt) || isEnumBaseCompare(rsym, clt)))
        return;

    if (clt.isSimpleBitVector() && crt.isSimpleBitVector()) {
        const bool sameSign = clt.isSigned() == crt.isSigned() ||
                              signMatches(lhs.getEffectiveSign(/* isForConversion */ false),
                                          rhs.getEffectiveSign(/* isForConversion */ false));

        if (isComparison) {
            // Comparisons of bit vectors should warn if the signs differ and
            // otherwise should not warn, otherwise you can get quite misleading
            // results like:
            //      logic [7:0] a, b;
            //      bit b = a + b < 257;
            // We don't want a warning for the comparison between logic[7:0] and
            // int because the addition will actually be promoted correctly and
            // everything will work as expected.
            if (sameSign)
                return;

            if ((clt.getBitWidth() == 8 && clt.isPredefinedInteger() && rhs.isImplicitString()) ||
                (crt.getBitWidth() == 8 && crt.isPredefinedInteger() && lhs.isImplicitString())) {
                // Don't warn if the comparison is between `byte` and a string literal.
                return;
            }

            auto& diag = context.addDiag(diag::SignCompare, opRange);
            SLANG_ASSERT(!extraDiagArg);
            diag << originalLt << originalRt;
            diag << lhs.sourceRange << rhs.sourceRange;
            return;
        }

        if (sameSign) {
            // If we have two integers of the same effective sign and size
            // (using the same ideas as in checkImplicitConversions) then we
            // should not warn.
            auto alw = clt.getBitWidth();
            auto arw = crt.getBitWidth();
            if (alw == arw)
                return;

            auto elw = lhs.getEffectiveWidth();
            auto erw = rhs.getEffectiveWidth();
            if (!elw || !erw)
                return;

            if (elw <= arw && alw >= erw)
                return;

            // If either side is a constant we'll assume the max allowed
            // width is actually unbounded.
            EvalContext evalCtx(context);
            if (lhs.eval(evalCtx))
                alw = SVInt::MAX_BITS;
            if (rhs.eval(evalCtx))
                arw = SVInt::MAX_BITS;

            if (elw <= arw && alw >= erw)
                return;
        }
    }
    else if (clt.isHandleType() && crt.isHandleType()) {
        // Ignore operations between handles (like comparing a class handle with null).
        return;
    }
    else if (clt.isNumeric() && crt.isNumeric()) {
        // If either side is a constant we might want to avoid warning.
        // The cases that I think make sense are:
        // - comparing any numeric value against the constant 0
        // - any floating value operator alongside an integer constant
        EvalContext evalCtx(context);
        auto lcv = lhs.eval(evalCtx);
        auto rcv = rhs.eval(evalCtx);
        if (lcv || rcv) {
            if (clt.isFloating() && crt.isIntegral() && rcv)
                return;
            if (crt.isFloating() && clt.isIntegral() && lcv)
                return;

            if (isComparison) {
                if (lcv.isInteger() && bool(lcv.integer() == 0))
                    return;
                if (rcv.isInteger() && bool(rcv.integer() == 0))
                    return;
            }
        }
    }
    else if ((clt.isString() && rhs.isImplicitString()) ||
             (crt.isString() && lhs.isImplicitString())) {
        // Ignore operations between strings and string literals.
        return;
    }

    auto& diag = context.addDiag(code, opRange);
    if (extraDiagArg)
        diag << *extraDiagArg;
    diag << originalLt << originalRt;
    diag << lhs.sourceRange << rhs.sourceRange;
}